

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommentReliablePdu.cpp
# Opt level: O3

void __thiscall DIS::CommentReliablePdu::marshal(CommentReliablePdu *this,DataStream *dataStream)

{
  uint *puVar1;
  pointer pFVar2;
  pointer pVVar3;
  long lVar4;
  ulong uVar5;
  FixedDatum x;
  VariableDatum local_60;
  
  SimulationManagementWithReliabilityFamilyPdu::marshal
            (&this->super_SimulationManagementWithReliabilityFamilyPdu,dataStream);
  DataStream::operator<<
            (dataStream,
             (uint)((ulong)((long)(this->_fixedDatumRecords).
                                  super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_fixedDatumRecords).
                                 super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (int)((ulong)((long)(this->_variableDatumRecords).
                                 super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_variableDatumRecords).
                                super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555);
  pFVar2 = (this->_fixedDatumRecords).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_fixedDatumRecords).
      super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pFVar2) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__FixedDatum_001a00a8;
      local_60._8_8_ = *(undefined8 *)((long)&pFVar2->_vptr_FixedDatum + lVar4);
      FixedDatum::marshal((FixedDatum *)&local_60,dataStream);
      FixedDatum::~FixedDatum((FixedDatum *)&local_60);
      uVar5 = uVar5 + 1;
      pFVar2 = (this->_fixedDatumRecords).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (ulong)((long)(this->_fixedDatumRecords).
                                   super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 4));
  }
  pVVar3 = (this->_variableDatumRecords).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_variableDatumRecords).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar3) {
    lVar4 = 0x28;
    uVar5 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__VariableDatum_001a1730;
      puVar1 = (uint *)((long)&pVVar3->_vptr_VariableDatum + lVar4);
      local_60._variableDatumID = puVar1[-8];
      local_60._variableDatumLength = puVar1[-7];
      std::vector<char,_std::allocator<char>_>::vector
                (&local_60._variableDatums,(vector<char,_std::allocator<char>_> *)(puVar1 + -6));
      local_60._arrayLength = *puVar1;
      VariableDatum::marshal(&local_60,dataStream);
      VariableDatum::~VariableDatum(&local_60);
      uVar5 = uVar5 + 1;
      pVVar3 = (this->_variableDatumRecords).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x30;
    } while (uVar5 < (ulong)(((long)(this->_variableDatumRecords).
                                    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >> 4)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void CommentReliablePdu::marshal(DataStream& dataStream) const
{
    SimulationManagementWithReliabilityFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    dataStream << ( unsigned int )_fixedDatumRecords.size();
    dataStream << ( unsigned int )_variableDatumRecords.size();

     for(size_t idx = 0; idx < _fixedDatumRecords.size(); idx++)
     {
        FixedDatum x = _fixedDatumRecords[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _variableDatumRecords.size(); idx++)
     {
        VariableDatum x = _variableDatumRecords[idx];
        x.marshal(dataStream);
     }

}